

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix-qdf.cc
# Opt level: O3

void __thiscall QdfFixer::writeBinary(QdfFixer *this,unsigned_long_long val,size_t bytes)

{
  logic_error *this_00;
  size_t i;
  string data;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  if (8 < bytes) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"fix-qdf::writeBinary called with too many bytes");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  local_40 = local_30;
  std::__cxx11::string::_M_construct((ulong)&local_40,(char)bytes);
  if (bytes != 0) {
    do {
      *(char *)((long)local_40 + (bytes - 1)) = (char)val;
      bytes = bytes - 1;
      val = val >> 8;
    } while (bytes != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->out,(char *)local_40,local_38);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return;
}

Assistant:

void
QdfFixer::writeBinary(unsigned long long val, size_t bytes)
{
    if (bytes > sizeof(unsigned long long)) {
        throw std::logic_error("fix-qdf::writeBinary called with too many bytes");
    }
    std::string data(bytes, '\0');
    for (auto i = bytes; i > 0; --i) {
        data[i - 1] = static_cast<char>(val & 0xff); // i.e. val % 256
        val >>= 8;                                   // i.e. val = val / 256
    }
    out << data;
}